

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiViewportP * FindHoveredViewportFromPlatformWindowStack(ImVec2 mouse_platform_pos)

{
  ImGuiViewportP **ppIVar1;
  ImGuiViewportP *viewport;
  int n;
  ImGuiViewportP *best_candidate;
  ImGuiContext *g;
  bool local_39;
  ImRect local_38;
  ImGuiViewportP *local_28;
  int local_1c;
  ImGuiViewportP *local_18;
  ImGuiContext *local_10;
  ImVec2 local_8;
  
  local_10 = GImGui;
  local_18 = (ImGuiViewportP *)0x0;
  for (local_1c = 0; local_1c < (local_10->Viewports).Size; local_1c = local_1c + 1) {
    ppIVar1 = ImVector<ImGuiViewportP_*>::operator[](&local_10->Viewports,local_1c);
    local_28 = *ppIVar1;
    local_39 = false;
    if (((local_28->super_ImGuiViewport).Flags & 0x90U) == 0) {
      local_38 = ImGuiViewportP::GetRect((ImGuiViewportP *)0x1d1a2c);
      local_39 = ImRect::Contains(&local_38,&local_8);
    }
    if ((local_39 != false) &&
       ((local_18 == (ImGuiViewportP *)0x0 ||
        (local_18->LastFrontMostStampCount < local_28->LastFrontMostStampCount)))) {
      local_18 = local_28;
    }
  }
  return local_18;
}

Assistant:

static ImGuiViewportP* FindHoveredViewportFromPlatformWindowStack(const ImVec2 mouse_platform_pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* best_candidate = NULL;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        if (!(viewport->Flags & (ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_Minimized)) && viewport->GetRect().Contains(mouse_platform_pos))
            if (best_candidate == NULL || best_candidate->LastFrontMostStampCount < viewport->LastFrontMostStampCount)
                best_candidate = viewport;
    }
    return best_candidate;
}